

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  pointer *ppuVar1;
  pointer *pppFVar2;
  uint *puVar3;
  byte *pbVar4;
  Model *pMVar5;
  pointer paVar6;
  pointer paVar7;
  Mesh *pMVar8;
  iterator __position;
  bool bVar9;
  int iVar10;
  Face *pFVar11;
  int iVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong extraout_RAX;
  Logger *pLVar16;
  runtime_error *this_00;
  int iVar17;
  Material *pMVar18;
  byte bVar19;
  iterator iVar20;
  IndexArray *this_01;
  uint uVar21;
  ulong uVar22;
  byte *pbVar23;
  int iVar24;
  int iVar25;
  Face *face;
  Face *local_80;
  undefined4 local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  int local_50;
  int local_4c;
  int local_48;
  aiPrimitiveType local_44;
  pointer local_40;
  pointer local_38;
  
  pbVar14 = (byte *)(this->m_DataIt)._M_current;
  pbVar4 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar23 = pbVar4 + -1;
  bVar9 = pbVar23 == pbVar14 || pbVar14 == pbVar4;
  if (pbVar23 != pbVar14 && pbVar14 != pbVar4) {
    do {
      if (((ulong)*pbVar14 < 0x21) && ((0x100003601U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0)) {
        if (!bVar9) goto LAB_004614b7;
        break;
      }
      pbVar14 = pbVar14 + 1;
      bVar9 = pbVar14 == pbVar23 || pbVar14 == pbVar4;
    } while (pbVar14 != pbVar23 && pbVar14 != pbVar4);
  }
  goto LAB_004614d1;
  while (pbVar14 != pbVar23) {
LAB_004614b7:
    if (((*pbVar14 != 0x20) && (*pbVar14 != 9)) || (pbVar14 = pbVar14 + 1, pbVar14 == pbVar4))
    break;
  }
LAB_004614d1:
  (this->m_DataIt)._M_current = (char *)pbVar14;
  if ((pbVar14 != pbVar4) && (*pbVar14 != 0)) {
    local_80 = (Face *)operator_new(0x58);
    local_80->m_PrimitiveType = type;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80->m_pMaterial = (Material *)0x0;
    pbVar23 = (byte *)(this->m_DataIt)._M_current;
    if (pbVar23 == (byte *)(this->m_DataItEnd)._M_current) {
      bVar19 = 1;
    }
    else {
      pMVar5 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      paVar6 = *(pointer *)
                &(pMVar5->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl;
      local_48 = (int)((ulong)((long)*(pointer *)
                                      ((long)&(pMVar5->m_Vertices).
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      + 8) -
                              *(long *)&(pMVar5->m_Vertices).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl) >> 2) * -0x55555555;
      local_38 = *(pointer *)
                  ((long)&(pMVar5->m_TextureCoord).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  + 8);
      local_40 = *(pointer *)
                  &(pMVar5->m_TextureCoord).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl;
      local_4c = (int)((ulong)((long)local_38 - (long)local_40) >> 2) * -0x55555555;
      paVar7 = *(pointer *)
                ((long)&(pMVar5->m_Normals).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> +
                8);
      local_50 = (int)((ulong)((long)paVar7 - (long)paVar6) >> 2) * -0x55555555;
      local_74 = 0;
      iVar24 = 0;
      local_44 = type;
      do {
        uVar15 = (ulong)*pbVar23;
        if (uVar15 < 0x30) {
          uVar22 = 1;
          if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
            if (uVar15 != 0x2f) {
              if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004615fc;
              break;
            }
            if (local_44 == aiPrimitiveType_POINT) {
              pLVar16 = DefaultLogger::get();
              Logger::error(pLVar16,"Obj: Separator unexpected in point statement");
            }
            iVar25 = iVar24 + 1;
          }
          else {
            iVar25 = 0;
          }
        }
        else {
LAB_004615fc:
          iVar12 = atoi((char *)pbVar23);
          pFVar11 = local_80;
          uVar21 = -(iVar12 >> 0x1f);
          iVar17 = iVar12;
          for (iVar25 = iVar12; uVar21 = uVar21 + 1, 0x12 < iVar25 + 9U; iVar25 = iVar25 - iVar10) {
            iVar10 = iVar17 >> 0x1f;
            iVar25 = iVar17 / 10 + iVar10;
            iVar17 = iVar25 - iVar10;
          }
          iVar25 = (paVar6 != paVar7) + 1;
          if (iVar24 != 1) {
            iVar25 = iVar24;
          }
          if (local_40 != local_38) {
            iVar25 = iVar24;
          }
          if (iVar12 < 1) {
            if (-1 < iVar12) {
              if (local_80 != (Face *)0x0) {
                ObjFile::Face::~Face(local_80);
                operator_delete(pFVar11);
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,"OBJ: Invalid face indice","");
              std::runtime_error::runtime_error(this_00,(string *)local_70);
              *(undefined ***)this_00 = &PTR__runtime_error_00900168;
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (iVar25 == 2) {
              uVar13 = iVar12 + local_50;
              goto LAB_0046170a;
            }
            if (iVar25 == 1) {
              uVar13 = iVar12 + local_4c;
              goto LAB_004616da;
            }
            if (iVar25 == 0) {
              uVar13 = iVar12 + local_48;
              goto LAB_00461695;
            }
LAB_004616af:
            reportErrorTokenInFace(this);
          }
          else if (iVar25 == 2) {
            uVar13 = iVar12 - 1;
LAB_0046170a:
            uVar15 = (ulong)uVar13;
            local_70[0] = (undefined1 *)CONCAT44(local_70[0]._4_4_,uVar13);
            iVar20._M_current =
                 (local_80->m_normals).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar20._M_current ==
                (local_80->m_normals).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&local_80->m_normals,iVar20,(uint *)local_70);
              uVar15 = extraout_RAX;
            }
            else {
              *iVar20._M_current = uVar13;
              ppuVar1 = &(local_80->m_normals).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            local_74 = (undefined4)CONCAT71((int7)(uVar15 >> 8),1);
          }
          else {
            if (iVar25 == 1) {
              uVar13 = iVar12 - 1;
LAB_004616da:
              local_70[0] = (undefined1 *)CONCAT44(local_70[0]._4_4_,uVar13);
              iVar20._M_current =
                   (local_80->m_texturCoords).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar20._M_current !=
                  (local_80->m_texturCoords).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar20._M_current = uVar13;
                ppuVar1 = &(local_80->m_texturCoords).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
                goto LAB_00461735;
              }
              this_01 = &local_80->m_texturCoords;
            }
            else {
              if (iVar25 != 0) goto LAB_004616af;
              uVar13 = iVar12 - 1;
LAB_00461695:
              local_70[0] = (undefined1 *)CONCAT44(local_70[0]._4_4_,uVar13);
              iVar20._M_current =
                   (local_80->m_vertices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar20._M_current !=
                  (local_80->m_vertices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar20._M_current = uVar13;
                ppuVar1 = &(local_80->m_vertices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
                goto LAB_00461735;
              }
              this_01 = &local_80->m_vertices;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(this_01,iVar20,(uint *)local_70);
          }
LAB_00461735:
          uVar22 = (ulong)uVar21;
        }
        pbVar23 = (byte *)((this->m_DataIt)._M_current + uVar22);
        (this->m_DataIt)._M_current = (char *)pbVar23;
        iVar24 = iVar25;
      } while (pbVar23 != (byte *)(this->m_DataItEnd)._M_current);
      bVar19 = (byte)local_74 ^ 1;
    }
    if ((local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pLVar16 = DefaultLogger::get();
      Logger::error(pLVar16,"Obj: Ignoring empty face");
      pFVar11 = local_80;
      pbVar23 = (byte *)(this->m_DataIt)._M_current;
      pbVar14 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar14 + -1 != pbVar23 && pbVar23 != pbVar14) {
        while ((0xd < *pbVar23 || ((0x3401U >> (*pbVar23 & 0x1f) & 1) == 0))) {
          pbVar23 = pbVar23 + 1;
          if ((pbVar23 == pbVar14) || (pbVar23 == pbVar14 + -1)) break;
        }
      }
      pbVar4 = pbVar23;
      if (pbVar23 != pbVar14) {
        pbVar23 = pbVar23 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar4 = pbVar23;
      }
      for (; (pbVar4 != pbVar14 && ((*pbVar4 == 0x20 || (pbVar23 = pbVar4, *pbVar4 == 9))));
          pbVar4 = pbVar4 + 1) {
        pbVar23 = pbVar14;
      }
      (this->m_DataIt)._M_current = (char *)pbVar23;
      if (local_80 != (Face *)0x0) {
        ObjFile::Face::~Face(local_80);
        operator_delete(pFVar11);
      }
    }
    else {
      pMVar5 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar18 = pMVar5->m_pCurrentMaterial;
      if (pMVar18 == (Material *)0x0) {
        pMVar18 = pMVar5->m_pDefaultMaterial;
      }
      local_80->m_pMaterial = pMVar18;
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent ==
          (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
      }
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh ==
          (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
      }
      pMVar8 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh;
      __position._M_current =
           *(pointer *)
            ((long)&(pMVar8->m_Faces).
                    super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
            + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pMVar8->m_Faces).
                   super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
           + 0x10)) {
        std::vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>>::
        _M_realloc_insert<Assimp::ObjFile::Face*const&>
                  ((vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>> *)
                   &pMVar8->m_Faces,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppFVar2 = (pointer *)
                   ((long)&(pMVar8->m_Faces).
                           super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                   + 8);
        *pppFVar2 = *pppFVar2 + 1;
      }
      puVar3 = &((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh->m_uiNumIndices;
      *puVar3 = *puVar3 + (int)((ulong)((long)(local_80->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_80->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar3 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh->m_uiUVCoordinates;
      *puVar3 = *puVar3 + (int)((ulong)((long)(local_80->m_texturCoords).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_80->m_texturCoords).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      pMVar8 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh;
      if (((bVar19 | pMVar8->m_hasNormals) & 1) == 0) {
        pMVar8->m_hasNormals = true;
      }
      pbVar23 = (byte *)(this->m_DataIt)._M_current;
      pbVar14 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar14 + -1 != pbVar23 && pbVar23 != pbVar14) {
        do {
          if (((*pbVar23 < 0xe) && ((0x3401U >> (*pbVar23 & 0x1f) & 1) != 0)) ||
             (pbVar23 = pbVar23 + 1, pbVar23 == pbVar14)) break;
        } while (pbVar23 != pbVar14 + -1);
      }
      pbVar4 = pbVar23;
      if (pbVar23 != pbVar14) {
        pbVar23 = pbVar23 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar4 = pbVar23;
      }
      for (; (pbVar4 != pbVar14 && ((*pbVar4 == 0x20 || (pbVar23 = pbVar4, *pbVar4 == 9))));
          pbVar4 = pbVar4 + 1) {
        pbVar23 = pbVar14;
      }
      (this->m_DataIt)._M_current = (char *)pbVar23;
    }
  }
  return;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}